

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createLifetimeEnd(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  Use *pUVar1;
  PSNode *pPVar2;
  PSNode *op1;
  PSNode *local_10;
  
  pUVar1 = llvm::User::getOperandList((User *)Inst);
  local_10 = getOperand(this,*(Value **)(pUVar1 + 0x20));
  pPVar2 = PointerGraph::create<(dg::pta::PSNodeType)17,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_10);
  return pPVar2;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createLifetimeEnd(const llvm::Instruction *Inst) {
    PSNode *op1 = getOperand(Inst->getOperand(1));
    return PS.create<PSNodeType::INVALIDATE_OBJECT>(op1);
}